

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_filter.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalFilter::PhysicalFilter
          (PhysicalFilter *this,vector<duckdb::LogicalType,_true> *types,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *select_list,idx_t estimated_cardinality)

{
  pointer puVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  pointer pBVar3;
  reference pvVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  pointer __args;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  vector<duckdb::LogicalType,_true> local_48;
  
  local_48.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CachingPhysicalOperator::CachingPhysicalOperator
            (&this->super_CachingPhysicalOperator,FILTER,&local_48,estimated_cardinality);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  (this->super_CachingPhysicalOperator).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalFilter_01995948;
  (this->expression).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  if ((ulong)((long)(select_list->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(select_list->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](select_list,0);
    _Var2._M_head_impl =
         (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    _Var5._M_head_impl =
         (this->expression).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this->expression).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
  }
  else {
    _Var2._M_head_impl = (Expression *)operator_new(0x70);
    BoundConjunctionExpression::BoundConjunctionExpression
              ((BoundConjunctionExpression *)_Var2._M_head_impl,CONJUNCTION_AND);
    __args = (select_list->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (select_list->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__args != puVar1) {
      local_50._M_head_impl = _Var2._M_head_impl;
      do {
        pBVar3 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                 ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                               *)&local_50);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar3->children,__args);
        __args = __args + 1;
        _Var2._M_head_impl = local_50._M_head_impl;
      } while (__args != puVar1);
    }
    local_50._M_head_impl = (Expression *)0x0;
    _Var5._M_head_impl =
         (this->expression).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this->expression).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var5._M_head_impl == (Expression *)0x0) {
      return;
    }
    (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
    _Var5._M_head_impl = local_50._M_head_impl;
  }
  if (_Var5._M_head_impl != (Expression *)0x0) {
    (**(code **)((long)((_Var5._M_head_impl)->super_BaseExpression)._vptr_BaseExpression + 8))();
  }
  return;
}

Assistant:

PhysicalFilter::PhysicalFilter(vector<LogicalType> types, vector<unique_ptr<Expression>> select_list,
                               idx_t estimated_cardinality)
    : CachingPhysicalOperator(PhysicalOperatorType::FILTER, std::move(types), estimated_cardinality) {
	D_ASSERT(select_list.size() > 0);
	if (select_list.size() > 1) {
		// create a big AND out of the expressions
		auto conjunction = make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND);
		for (auto &expr : select_list) {
			conjunction->children.push_back(std::move(expr));
		}
		expression = std::move(conjunction);
	} else {
		expression = std::move(select_list[0]);
	}
}